

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O3

vorbis_look_residue * res0_look(vorbis_dsp_state *vd,vorbis_info_residue *vr)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  size_t __nmemb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  puVar5 = (undefined8 *)calloc(1,0x50);
  pvVar8 = vd->vi->codec_setup;
  *puVar5 = vr;
  uVar1 = *(uint *)((long)vr + 0x14);
  __nmemb = (size_t)(int)uVar1;
  *(uint *)(puVar5 + 1) = uVar1;
  lVar17 = *(long *)((long)pvVar8 + 0x1328);
  puVar5[2] = lVar17;
  lVar12 = (long)*(int *)((long)vr + 0x1c) * 0x60;
  puVar5[3] = lVar17 + lVar12;
  uVar2 = *(undefined8 *)(lVar17 + lVar12);
  pvVar6 = calloc(__nmemb,8);
  puVar5[4] = pvVar6;
  if ((long)__nmemb < 1) {
    uVar4 = 0;
  }
  else {
    sVar16 = 0;
    uVar4 = 0;
    iVar19 = 0;
    do {
      uVar3 = ov_ilog(*(ogg_uint32_t *)((long)vr + sVar16 * 4 + 0x20));
      if (uVar3 != 0) {
        if ((int)uVar4 < (int)uVar3) {
          uVar4 = uVar3;
        }
        pvVar7 = calloc((long)(int)uVar3,8);
        *(void **)((long)pvVar6 + sVar16 * 8) = pvVar7;
        if (0 < (int)uVar3) {
          uVar9 = *(uint *)((long)vr + sVar16 * 4 + 0x20);
          uVar14 = 0;
          do {
            if ((uVar9 >> ((uint)uVar14 & 0x1f) & 1) != 0) {
              lVar17 = (long)iVar19;
              iVar19 = iVar19 + 1;
              *(long *)(*(long *)((long)pvVar6 + sVar16 * 8) + uVar14 * 8) =
                   (long)*(int *)((long)vr + lVar17 * 4 + 0x120) * 0x60 +
                   *(long *)((long)pvVar8 + 0x1328);
            }
            uVar14 = uVar14 + 1;
          } while (uVar3 != uVar14);
        }
      }
      sVar16 = sVar16 + 1;
    } while (sVar16 != __nmemb);
  }
  *(undefined4 *)(puVar5 + 5) = 1;
  uVar3 = (uint)uVar2;
  if ((int)uVar3 < 1) {
    uVar9 = 1;
  }
  else {
    uVar9 = uVar3 - 1;
    auVar23 = _DAT_001f9700;
    iVar19 = 4;
    do {
      auVar20 = auVar23;
      auVar23._0_4_ = auVar20._0_4_ * uVar1;
      auVar21._8_4_ = (undefined4)((auVar20._8_8_ & 0xffffffff) * (ulong)uVar1);
      auVar21._4_4_ = auVar21._8_4_;
      auVar21._0_4_ = auVar23._0_4_;
      auVar21._12_4_ = auVar20._12_4_ * uVar1;
      auVar23._8_8_ = auVar21._8_8_;
      auVar23._4_4_ = auVar20._4_4_ * uVar1;
      iVar10 = iVar19 + -4;
      iVar13 = iVar19 + (uVar3 + 3 & 0xfffffffc);
      iVar19 = iVar10;
    } while (iVar13 != 8);
    uVar11 = -iVar10;
    auVar22._0_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
    auVar22._4_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 1) ^ 0x80000000));
    auVar22._8_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 2) ^ 0x80000000));
    auVar22._12_4_ = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 3) ^ 0x80000000));
    auVar23 = ~auVar22 & auVar23 | auVar20 & auVar22;
    uVar9 = auVar23._8_4_ * auVar23._0_4_ * auVar23._4_4_ * auVar23._12_4_;
    *(uint *)(puVar5 + 5) = uVar9;
  }
  *(uint *)((long)puVar5 + 0xc) = uVar4;
  pvVar8 = malloc((long)(int)uVar9 * 8);
  puVar5[6] = pvVar8;
  if (0 < (int)uVar9) {
    uVar14 = 0;
    do {
      pvVar6 = malloc((long)(int)uVar3 * 4);
      *(void **)((long)pvVar8 + uVar14 * 8) = pvVar6;
      if (0 < (int)uVar3) {
        uVar18 = 0;
        uVar15 = uVar14;
        lVar17 = (long)((int)uVar9 / (int)uVar1);
        do {
          lVar12 = (long)uVar15 / lVar17;
          uVar15 = (long)uVar15 % lVar17;
          lVar17 = lVar17 / (long)__nmemb;
          *(int *)((long)pvVar6 + uVar18 * 4) = (int)lVar12;
          uVar18 = uVar18 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar18);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar9);
  }
  return puVar5;
}

Assistant:

vorbis_look_residue *res0_look(vorbis_dsp_state *vd,
                               vorbis_info_residue *vr){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  vorbis_look_residue0 *look=_ogg_calloc(1,sizeof(*look));
  codec_setup_info     *ci=vd->vi->codec_setup;

  int j,k,acc=0;
  int dim;
  int maxstage=0;
  look->info=info;

  look->parts=info->partitions;
  look->fullbooks=ci->fullbooks;
  look->phrasebook=ci->fullbooks+info->groupbook;
  dim=look->phrasebook->dim;

  look->partbooks=_ogg_calloc(look->parts,sizeof(*look->partbooks));

  for(j=0;j<look->parts;j++){
    int stages=ov_ilog(info->secondstages[j]);
    if(stages){
      if(stages>maxstage)maxstage=stages;
      look->partbooks[j]=_ogg_calloc(stages,sizeof(*look->partbooks[j]));
      for(k=0;k<stages;k++)
        if(info->secondstages[j]&(1<<k)){
          look->partbooks[j][k]=ci->fullbooks+info->booklist[acc++];
#ifdef TRAIN_RES
          look->training_data[k][j]=_ogg_calloc(look->partbooks[j][k]->entries,
                                           sizeof(***look->training_data));
#endif
        }
    }
  }

  look->partvals=1;
  for(j=0;j<dim;j++)
      look->partvals*=look->parts;

  look->stages=maxstage;
  look->decodemap=_ogg_malloc(look->partvals*sizeof(*look->decodemap));
  for(j=0;j<look->partvals;j++){
    long val=j;
    long mult=look->partvals/look->parts;
    look->decodemap[j]=_ogg_malloc(dim*sizeof(*look->decodemap[j]));
    for(k=0;k<dim;k++){
      long deco=val/mult;
      val-=deco*mult;
      mult/=look->parts;
      look->decodemap[j][k]=deco;
    }
  }
#if defined(TRAIN_RES) || defined (TRAIN_RESAUX)
  {
    static int train_seq=0;
    look->train_seq=train_seq++;
  }
#endif
  return(look);
}